

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::fetchTexture
               (SurfaceAccess *dst,ConstPixelBufferAccess *src,float *texCoord,Vec4 *colorScale,
               Vec4 *colorBias)

{
  int iVar1;
  float fVar2;
  float v1;
  float v2;
  float local_c0;
  float local_bc;
  undefined1 local_a8 [16];
  Vector<float,_4> local_98;
  Vec4 local_88;
  float local_78;
  float local_74;
  float s;
  float triY;
  float triX;
  int triNdx;
  float xf;
  float yf;
  int x;
  int y;
  Vec3 triS [2];
  Vec4 sq;
  Vec4 *colorBias_local;
  Vec4 *colorScale_local;
  float *texCoord_local;
  ConstPixelBufferAccess *src_local;
  SurfaceAccess *dst_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triS[1].m_data + 1),*texCoord,texCoord[1],texCoord[2],texCoord[3])
  ;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&x,(int)triS + 0x10,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)triS + 0x10,3,2);
  for (yf = 0.0; fVar2 = yf, iVar1 = tcu::SurfaceAccess::getHeight(dst), (int)fVar2 < iVar1;
      yf = (float)((int)yf + 1)) {
    for (xf = 0.0; fVar2 = xf, iVar1 = tcu::SurfaceAccess::getWidth(dst), (int)fVar2 < iVar1;
        xf = (float)((int)xf + 1)) {
      fVar2 = (float)(int)yf;
      iVar1 = tcu::SurfaceAccess::getHeight(dst);
      triNdx = (int)((fVar2 + 0.5) / (float)iVar1);
      fVar2 = (float)(int)xf;
      iVar1 = tcu::SurfaceAccess::getWidth(dst);
      triX = (fVar2 + 0.5) / (float)iVar1;
      triY = (float)(uint)(1.0 <= triX + (float)triNdx);
      local_bc = triX;
      if (triY != 0.0) {
        local_bc = 1.0 - triX;
      }
      s = local_bc;
      if (triY == 0.0) {
        local_c0 = (float)triNdx;
      }
      else {
        local_c0 = 1.0 - (float)triNdx;
      }
      local_74 = local_c0;
      fVar2 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(&x + (long)(int)triY * 3));
      v1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(&x + (long)(int)triY * 3));
      v2 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(&x + (long)(int)triY * 3));
      local_78 = triangleInterpolate(fVar2,v1,v2,s,local_74);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_a8,(int)src,(int)local_78,0);
      tcu::operator*((tcu *)&local_98,(Vector<float,_4> *)local_a8,colorScale);
      tcu::operator+((tcu *)&local_88,&local_98,colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_88,(int)xf,(int)yf);
    }
  }
  return;
}

Assistant:

void fetchTexture (const tcu::SurfaceAccess& dst, const tcu::ConstPixelBufferAccess& src, const float* texCoord, const tcu::Vec4& colorScale, const tcu::Vec4& colorBias)
{
	const tcu::Vec4		sq			= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);
	const tcu::Vec3		triS[2]		= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			const float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			const float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			const int	triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			const float	triX	= triNdx ? 1.0f-xf : xf;
			const float	triY	= triNdx ? 1.0f-yf : yf;

			const float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);

			dst.setPixel(src.getPixel((int)s, 0) * colorScale + colorBias, x, y);
		}
	}
}